

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall
QMetaObjectBuilder::addClassInfo(QMetaObjectBuilder *this,QByteArray *name,QByteArray *value)

{
  qsizetype qVar1;
  
  qVar1 = (this->d->classInfoNames).d.size;
  QList<QByteArray>::emplaceBack<QByteArray_const&>(&this->d->classInfoNames,name);
  QList<QByteArray>::emplaceBack<QByteArray_const&>(&this->d->classInfoValues,value);
  return (int)qVar1;
}

Assistant:

int QMetaObjectBuilder::addClassInfo(const QByteArray &name, const QByteArray &value)
{
    int index = d->classInfoNames.size();
    d->classInfoNames += name;
    d->classInfoValues += value;
    return index;
}